

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::drawTranslateHandles(XFormWidget *this)

{
  const_reference pvVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  double __x;
  byte local_249;
  double local_240;
  Vector3D local_238;
  double local_220;
  Vector3D local_218;
  Vector3D local_200;
  undefined1 local_1e8 [8];
  Vector3D p1;
  Vector3D local_1c8;
  double local_1b0;
  Vector3D local_1a8;
  Vector3D local_190;
  undefined1 local_178 [8];
  Vector3D p0;
  double theta2;
  double theta1;
  double dStack_148;
  int j;
  undefined1 local_140 [8];
  Vector3D e1;
  undefined1 local_120 [8];
  Vector3D e0;
  Vector3D local_100;
  undefined1 local_e8 [8];
  Vector3D b_1;
  undefined1 local_b8 [8];
  Vector3D a;
  double dStack_98;
  int i_1;
  Vector3D local_90;
  undefined1 local_78 [8];
  Vector3D b;
  undefined1 local_58 [4];
  int i;
  double local_40;
  double r;
  Vector3D c;
  int startAxis;
  int nSides;
  double arrowSize;
  XFormWidget *this_local;
  
  c.z._4_4_ = 8;
  if ((this->target).object != (SceneObject *)0x0) {
    local_249 = 0;
    if ((this->transformedMode & 1U) != 0) {
      local_249 = this->objectMode ^ 0xff;
    }
    c.z._0_4_ = 0;
    if ((local_249 & 1) != 0) {
      c.z._0_4_ = 2;
    }
    Vector3D::Vector3D((Vector3D *)&r,&this->center);
    Vector3D::operator-((Vector3D *)local_58,&(this->bounds).max,&(this->bounds).min);
    local_40 = Vector3D::norm((Vector3D *)local_58);
    local_40 = local_40 / 2.0;
    glLineWidth(0x41000000);
    glBegin(1);
    for (b.z._4_4_ = c.z._0_4_; b.z._4_4_ < 3; b.z._4_4_ = b.z._4_4_ + 1) {
      dStack_98 = local_40 * 0.85;
      pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)b.z._4_4_);
      CMU462::operator*(&local_90,&stack0xffffffffffffff68,pvVar1);
      Vector3D::operator+((Vector3D *)local_78,(Vector3D *)&r,&local_90);
      pvVar2 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](&this->axisColors,(long)b.z._4_4_);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar2,0);
      glColor4ubv(pvVar3);
      glVertex3dv(&r);
      glVertex3dv(local_78);
    }
    glEnd();
    glBegin(4);
    for (a.z._4_4_ = c.z._0_4_; a.z._4_4_ < 3; a.z._4_4_ = a.z._4_4_ + 1) {
      pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)a.z._4_4_);
      CMU462::operator*((Vector3D *)&b_1.z,&local_40,pvVar1);
      Vector3D::operator+((Vector3D *)local_b8,(Vector3D *)&r,(Vector3D *)&b_1.z);
      e0.z = local_40 * 0.85;
      pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)a.z._4_4_);
      CMU462::operator*(&local_100,&e0.z,pvVar1);
      Vector3D::operator+((Vector3D *)local_e8,(Vector3D *)&r,&local_100);
      e1.z = local_40 * 0.5 * 0.15;
      pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((a.z._4_4_ + 1) % 3));
      CMU462::operator*((Vector3D *)local_120,&e1.z,pvVar1);
      dStack_148 = local_40 * 0.5 * 0.15;
      pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((a.z._4_4_ + 2) % 3));
      CMU462::operator*((Vector3D *)local_140,&stack0xfffffffffffffeb8,pvVar1);
      pvVar2 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](&this->axisColors,(long)a.z._4_4_);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar2,0);
      glColor4ubv(pvVar3);
      for (theta1._4_4_ = 0; theta1._4_4_ < 8; theta1._4_4_ = theta1._4_4_ + 1) {
        __x = ((double)theta1._4_4_ * 6.283185307179586) / 8.0;
        p0.z = ((double)(theta1._4_4_ + 1) * 6.283185307179586) / 8.0;
        local_1b0 = cos(__x);
        CMU462::operator*(&local_1a8,&local_1b0,(Vector3D *)local_120);
        Vector3D::operator+(&local_190,(Vector3D *)local_e8,&local_1a8);
        p1.z = sin(__x);
        CMU462::operator*(&local_1c8,&p1.z,(Vector3D *)local_140);
        Vector3D::operator-((Vector3D *)local_178,&local_190,&local_1c8);
        local_220 = cos(p0.z);
        CMU462::operator*(&local_218,&local_220,(Vector3D *)local_120);
        Vector3D::operator+(&local_200,(Vector3D *)local_e8,&local_218);
        local_240 = sin(p0.z);
        CMU462::operator*(&local_238,&local_240,(Vector3D *)local_140);
        Vector3D::operator-((Vector3D *)local_1e8,&local_200,&local_238);
        glVertex3dv(local_b8);
        glVertex3dv(local_178);
        glVertex3dv(local_1e8);
        glVertex3dv(local_178);
        glVertex3dv(local_e8);
        glVertex3dv(local_1e8);
      }
    }
    glEnd();
    if (((this->transformedMode & 1U) == 0) || ((this->objectMode & 1U) != 0)) {
      drawCenterHandle(this);
    }
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawTranslateHandles() const
{
   const double arrowSize = .15;
   const int nSides = 8;

   if (target.object == nullptr) return;
   
   int startAxis = (transformedMode && !objectMode) ? 2 : 0;

   Vector3D c = center;
   double r = (bounds.max - bounds.min).norm() / 2.;

   // Draw arrow stems
   glLineWidth( 8. );
   glBegin( GL_LINES );
   for( int i = startAxis; i < 3; i++ )
   {
      Vector3D b = c + (1.-arrowSize)*r*axes[i];

      glColor4ubv( &axisColors[i][0] );

      glVertex3dv( &c.x );
      glVertex3dv( &b.x );
   }
   glEnd();

   // Draw arrow heads
   glBegin( GL_TRIANGLES );
   for( int i = startAxis; i < 3; i++ )
   {
      Vector3D a = c + r*axes[i];
      Vector3D b = c + (1.-arrowSize)*r*axes[i];
      Vector3D e0 = r*.5*arrowSize*axes[(i+1)%3];
      Vector3D e1 = r*.5*arrowSize*axes[(i+2)%3];

      glColor4ubv( &axisColors[i][0] );

      for( int j = 0; j < nSides; j++ )
      {
         double theta1 = 2.*M_PI * (double) j / (double) nSides;
         double theta2 = 2.*M_PI * (double) (j+1) / (double) nSides;
         Vector3D p0 = b + cos(theta1)*e0 - sin(theta1)*e1;
         Vector3D p1 = b + cos(theta2)*e0 - sin(theta2)*e1;

         glVertex3dv( &a.x );
         glVertex3dv( &p0.x );
         glVertex3dv( &p1.x );

         glVertex3dv( &p0.x );
         glVertex3dv( &b.x );
         glVertex3dv( &p1.x );
      }

   }
   glEnd();

   if (!transformedMode || objectMode) drawCenterHandle();
   glLineWidth( 1. );
}